

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cpp
# Opt level: O1

void __thiscall Code_generator::visit(Code_generator *this,Inst_load_store_indirect *s)

{
  uint uVar1;
  Register *pRVar2;
  Expression *pEVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint16_t b;
  ushort uVar7;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ast::Instruction::check_alignment((Instruction *)s);
  pRVar2 = s->rn;
  if (7 < pRVar2->n) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Invalid register","");
    error_report(&pRVar2->location,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  uVar6 = s->ldst & 1;
  b = (ushort)(s->rn->n << 4) |
      (ushort)(uVar6 << 0xb) | (ushort)((s->ldst & 2) << 0xc) | (ushort)s->rd->n;
  if (s->constant == (Expression *)0x0) {
    b = b | (short)s->rm->n * 0x80 + 0x1000U;
  }
  else {
    iVar4 = (*s->constant->_vptr_Expression[3])();
    if ((char)iVar4 != '\0') {
      pEVar3 = s->constant;
      if (pEVar3->type == LABEL) {
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"Can\'t be a label, must be a constant","");
        error_report(&pEVar3->location,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
      }
      else if (pEVar3->type == ABSOLUTE) {
        uVar1 = pEVar3->value;
        uVar5 = uVar1 & 0xffff;
        if (uVar6 == 0) {
          if (0xf < (ushort)uVar1) {
            string_printf_abi_cxx11_
                      (&local_70,
                       "Expression\'s value / 2 = %d (0x%x) not encodable in %d bit,truncate to %d (0x%x)"
                       ,(ulong)uVar5,(ulong)uVar5,3,(ulong)(uVar1 & 7),uVar1 & 7);
            warning_report(&pEVar3->location,&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
          }
          if ((uVar1 & 1) != 0) {
            pEVar3 = s->constant;
            string_printf_abi_cxx11_
                      (&local_90,"Expression\'s value = %d (0x%x) must be an even value",
                       (ulong)uVar5,(ulong)uVar5);
            warning_report(&pEVar3->location,&local_90);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p);
            }
          }
          uVar7 = (ushort)(uVar1 << 6);
        }
        else {
          if (7 < (ushort)uVar1) {
            string_printf_abi_cxx11_
                      (&local_50,
                       "Expression\'s value = %d (0x%x) not encodable in %d bit, truncate to %d (0x%x)"
                       ,(ulong)uVar5,(ulong)uVar5,3,(ulong)(uVar1 & 7),uVar1 & 7);
            warning_report(&pEVar3->location,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
          }
          uVar7 = (ushort)(uVar5 << 7);
        }
        b = b | uVar7 & 0x380;
      }
    }
  }
  ast::Sections::write16(*(uint *)&s->field_0x40,*(uint *)&s->field_0x44,b);
  return;
}

Assistant:

void Code_generator::visit(Inst_load_store_indirect *s)
{
	s->check_alignment();
	if (s->rn->n > 7)
		error_report(&s->rn->location, "Invalid register");
	auto byte = s->ldst & 1;
	auto code = ((s->ldst & 2) ? STR_INDIRECT_OPCODE : LDR_INDIRECT_OPCODE)
			| (byte << LDR_STR_INDIRECT_BYTE_INDICATION_POSITION)
			| (s->rd->n << RD_POSITION) | (s->rn->n << RN_POSITION);
	if (s->constant == nullptr) {
		code |= (1 << LDR_STR_INDIRECT_REG_INDICATION_POSITION) + (s->rm->n << RM_POSITION);
	} else if (s->constant->evaluate()) {
		auto constant_type = s->constant->get_type();
		if (constant_type == ABSOLUTE) {
			auto constant_value = s->constant->get_value();
			if (constant_value < 0) {
				error_report(&s->constant->location,"Expression's value must a positive number");
			}
			else {
				if (byte) {
					if ((constant_value & ~MAKE_MASK(LDR_STR_INDIRECT_CONST_INDEX_SIZE, 0)) != 0) {
						warning_report(&s->constant->location,
							string_printf("Expression's value = %d (0x%x) not encodable in %d bit,"
									" truncate to %d (0x%x)",
							constant_value, constant_value, LDR_STR_INDIRECT_CONST_INDEX_SIZE,
							constant_value & MAKE_MASK(LDR_STR_INDIRECT_CONST_INDEX_SIZE, 0),
							constant_value & MAKE_MASK(LDR_STR_INDIRECT_CONST_INDEX_SIZE, 0)));
					}
					code |= ((constant_value & MAKE_MASK(LDR_STR_INDIRECT_CONST_INDEX_SIZE, 0))
										<< LDR_STR_INDIRECT_CONST_INDEX_POSITION);
				}
				else {
					if (((constant_value / 2) & ~MAKE_MASK(LDR_STR_INDIRECT_CONST_INDEX_SIZE, 0)) != 0) {
						warning_report(&s->constant->location,
							string_printf( "Expression's value / 2 = %d (0x%x) not encodable in %d bit,"
									"truncate to %d (0x%x)",
							constant_value, constant_value, LDR_STR_INDIRECT_CONST_INDEX_SIZE,
							constant_value & MAKE_MASK(LDR_STR_INDIRECT_CONST_INDEX_SIZE, 0),
							constant_value & MAKE_MASK(LDR_STR_INDIRECT_CONST_INDEX_SIZE, 0)));
					}
					if ((constant_value & 1) != 0)
						warning_report(&s->constant->location, string_printf(
							"Expression's value = %d (0x%x) must be an even value", constant_value, constant_value));
					constant_value /= 2;
					code |= ((constant_value & MAKE_MASK(LDR_STR_INDIRECT_CONST_INDEX_SIZE, 0))
										<< LDR_STR_INDIRECT_CONST_INDEX_POSITION);
				}
			}
		}
		else if (constant_type == Value_type::LABEL)
			error_report(&s->constant->location,"Can't be a label, must be a constant");
	}
	Sections::write16(s->section_index, s->section_offset, static_cast<uint16_t>(code));
}